

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_union.cpp
# Opt level: O2

bool duckdb::ContainsSink(PhysicalOperator *op)

{
  pointer prVar1;
  int iVar2;
  bool bVar3;
  reference_wrapper<duckdb::PhysicalOperator> *child;
  pointer prVar4;
  bool bVar5;
  
  iVar2 = (*op->_vptr_PhysicalOperator[0x21])();
  bVar3 = true;
  if ((char)iVar2 == '\0') {
    prVar4 = (op->children).
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    prVar1 = (op->children).
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar5 = prVar4 == prVar1;
      bVar3 = !bVar5;
      if (bVar5) {
        return bVar3;
      }
      bVar5 = ContainsSink(prVar4->_M_data);
      prVar4 = prVar4 + 1;
    } while (!bVar5);
  }
  return bVar3;
}

Assistant:

static bool ContainsSink(PhysicalOperator &op) {
	if (op.IsSink()) {
		return true;
	}
	for (auto &child : op.children) {
		if (ContainsSink(child)) {
			return true;
		}
	}
	return false;
}